

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O2

SegmentReader * __thiscall capnp::_::ReaderArena::tryGetSegment(ReaderArena *this,SegmentId id)

{
  MutexGuarded<kj::Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>_>_> *this_00;
  int iVar1;
  SegmentWordCount SVar2;
  Maybe<kj::Own<capnp::_::SegmentReader>_&> MVar3;
  undefined4 extraout_var;
  anon_union_72_1_a8c68091_for_NullableValue<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>_>_2
  *this_01;
  SegmentReader *pSVar4;
  size_t size;
  SegmentId id_local;
  Own<capnp::_::SegmentReader> local_48;
  Locked<kj::Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>_>_> lock;
  
  if (id.value == 0) {
    if ((this->segment0).ptr.size_ != 0) {
      return &this->segment0;
    }
    return (SegmentReader *)0x0;
  }
  this_00 = &this->moreSegments;
  this_01 = (anon_union_72_1_a8c68091_for_NullableValue<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>_>_2
             *)0x0;
  id_local = id;
  kj::_::Mutex::lock(&this_00->mutex,EXCLUSIVE);
  lock.ptr = &(this->moreSegments).value;
  lock.mutex = &this_00->mutex;
  if ((this->moreSegments).value.ptr.isSet == true) {
    this_01 = &(this->moreSegments).value.ptr.field_1;
    MVar3 = kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::find<unsigned_int&>
                      ((HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>> *)&this_01->value,
                       &id_local.value);
    id = id_local;
    if (MVar3.ptr != (Own<capnp::_::SegmentReader> *)0x0) {
      pSVar4 = (MVar3.ptr)->ptr;
      goto LAB_00216b47;
    }
  }
  iVar1 = (*this->message->_vptr_MessageReader[2])(this->message,(ulong)id.value);
  if (size == 0) {
    pSVar4 = (SegmentReader *)0x0;
  }
  else {
    SVar2 = verifySegmentSize(size);
    if (((lock.ptr)->ptr).isSet == false) {
      this_01 = (anon_union_72_1_a8c68091_for_NullableValue<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>_>_2
                 *)kj::_::
                   NullableValue<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>_>::
                   emplace<>(&(lock.ptr)->ptr);
    }
    pSVar4 = (SegmentReader *)operator_new(0x28);
    pSVar4->arena = &this->super_Arena;
    (pSVar4->id).value = id_local.value;
    (pSVar4->ptr).ptr = (word *)CONCAT44(extraout_var,iVar1);
    (pSVar4->ptr).size_ = (ulong)SVar2;
    pSVar4->readLimiter = &this->readLimiter;
    local_48.disposer = (Disposer *)&kj::_::HeapDisposer<capnp::_::SegmentReader>::instance;
    local_48.ptr = pSVar4;
    kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::insert
              (&this_01->value,id_local.value,&local_48);
    if (local_48.ptr != (SegmentReader *)0x0) {
      local_48.ptr = (SegmentReader *)0x0;
      (**(local_48.disposer)->_vptr_Disposer)();
    }
  }
LAB_00216b47:
  kj::Locked<kj::Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>_>_>::~Locked
            (&lock);
  return pSVar4;
}

Assistant:

SegmentReader* ReaderArena::tryGetSegment(SegmentId id) {
  if (id == SegmentId(0)) {
    if (segment0.getArray() == nullptr) {
      return nullptr;
    } else {
      return &segment0;
    }
  }

  auto lock = moreSegments.lockExclusive();

  SegmentMap* segments = nullptr;
  KJ_IF_MAYBE(s, *lock) {
    KJ_IF_MAYBE(segment, s->find(id.value)) {
      return *segment;
    }
    segments = s;
  }

  kj::ArrayPtr<const word> newSegment = message->getSegment(id.value);
  if (newSegment == nullptr) {
    return nullptr;
  }

  SegmentWordCount newSegmentSize = verifySegmentSize(newSegment.size());

  if (*lock == nullptr) {
    // OK, the segment exists, so allocate the map.
    segments = &lock->emplace();
  }

  auto segment = kj::heap<SegmentReader>(
      this, id, newSegment.begin(), newSegmentSize, &readLimiter);
  SegmentReader* result = segment;
  segments->insert(id.value, kj::mv(segment));
  return result;
}